

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O2

void __thiscall Diligent::BasicFile::BasicFile(BasicFile *this,FileOpenAttribs *OpenAttribs)

{
  EFileAccessMode EVar1;
  char *pcVar2;
  allocator local_19;
  
  this->_vptr_BasicFile = (_func_int **)&PTR__BasicFile_008a7990;
  pcVar2 = "";
  if (OpenAttribs->strFilePath != (Char *)0x0) {
    pcVar2 = OpenAttribs->strFilePath;
  }
  std::__cxx11::string::string((string *)&this->m_Path,pcVar2,&local_19);
  BasicFileSystem::CorrectSlashes(&this->m_Path,'\0');
  EVar1 = OpenAttribs->AccessMode;
  (this->m_OpenAttribs).strFilePath = (this->m_Path)._M_dataplus._M_p;
  (this->m_OpenAttribs).AccessMode = EVar1;
  return;
}

Assistant:

BasicFile::BasicFile(const FileOpenAttribs& OpenAttribs) :
    m_Path //
    {
        [](const Char* strPath) //
        {
            String Path = strPath != nullptr ? strPath : "";
            BasicFileSystem::CorrectSlashes(Path);
            return Path;
        }(OpenAttribs.strFilePath) //
    },
    m_OpenAttribs{m_Path.c_str(), OpenAttribs.AccessMode}
{
}